

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

void calcBias<Blob<48>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t bit;
  uint uVar3;
  int *piVar4;
  uint32_t bit_00;
  Blob<48> K;
  uint B;
  uint A;
  
  Blob<48>::Blob(&K);
  for (uVar3 = 0; uVar3 != (~(reps >> 0x1f) & reps); uVar3 = uVar3 + 1) {
    if ((verbose) && ((int)uVar3 % (reps / 10) == 0)) {
      putchar(0x2e);
    }
    Rand::rand_p(r,&K,6);
    (*hash)(&K,6,0,&A);
    piVar4 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (bit = 0; bit != 0x30; bit = bit + 1) {
      flipbit(&K,6,bit);
      (*hash)(&K,6,0,&B);
      flipbit(&K,6,bit);
      for (bit_00 = 0; bit_00 != 0x20; bit_00 = bit_00 + 1) {
        uVar1 = getbit(&A,4,bit_00);
        uVar2 = getbit(&B,4,bit_00);
        *piVar4 = *piVar4 + (uVar2 ^ uVar1);
        piVar4 = piVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}